

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<void>::operator()<>
          (Build_Function_Caller_Helper<void> *this)

{
  reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *this_00;
  Type_Conversions *t_conversions;
  Conversion_Saves *pCVar1;
  Function_Params local_118 [2];
  undefined1 local_f8 [8];
  Type_Conversions_State state_1;
  Type_Conversions conv;
  undefined1 local_28 [8];
  Type_Conversions_State state;
  array<chaiscript::Boxed_Value,_0UL> params;
  Build_Function_Caller_Helper<void> *this_local;
  
  state.m_saves._M_data._7_1_ = 0;
  if (this->m_conversions == (Type_Conversions *)0x0) {
    this_00 = &state_1.m_saves;
    Type_Conversions::Type_Conversions((Type_Conversions *)this_00);
    pCVar1 = Type_Conversions::conversion_saves((Type_Conversions *)this_00);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_f8,(Type_Conversions *)this_00,pCVar1);
    Function_Params::Function_Params<0ul>
              (local_118,(array<chaiscript::Boxed_Value,_0UL> *)((long)&state.m_saves._M_data + 7));
    call(this,local_118,(Type_Conversions_State *)local_f8);
    Type_Conversions::~Type_Conversions((Type_Conversions *)&state_1.m_saves);
  }
  else {
    t_conversions = this->m_conversions;
    pCVar1 = Type_Conversions::conversion_saves(this->m_conversions);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_28,t_conversions,pCVar1);
    Function_Params::Function_Params<0ul>
              ((Function_Params *)&conv.m_conversion_saves,
               (array<chaiscript::Boxed_Value,_0UL> *)((long)&state.m_saves._M_data + 7));
    call(this,(Function_Params *)&conv.m_conversion_saves,(Type_Conversions_State *)local_28);
  }
  return;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }